

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O3

void __thiscall OpenMD::GofRAngle::processOverlapping(GofRAngle *this,SelectionManager *sman)

{
  int iVar1;
  int iVar2;
  StuntDouble *pSVar3;
  StuntDouble *pSVar4;
  StuntDouble *pSVar5;
  long lVar6;
  int i;
  int k;
  int j;
  int local_54;
  int local_50;
  int local_4c;
  SelectionSet local_48;
  
  if (this->doSele3_ == true) {
    if ((this->evaluator3_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_48,&this->evaluator3_);
      lVar6 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->seleMan3_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6),
                   (vector<bool,_std::allocator<bool>_> *)
                   ((long)&((local_48.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6))
        ;
        lVar6 = lVar6 + 0x28;
      } while (lVar6 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_48.bitsets_);
    }
    iVar1 = OpenMDBitSet::countBits
                      ((sman->ss_).bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    iVar2 = OpenMDBitSet::countBits
                      ((this->seleMan3_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 != iVar2) {
      RadialDistrFunc::processOverlapping(&this->super_RadialDistrFunc,sman);
    }
    pSVar3 = SelectionManager::beginSelected(sman,&local_54);
    pSVar4 = SelectionManager::beginSelected(&this->seleMan3_,&local_50);
    if (pSVar4 != (StuntDouble *)0x0 && pSVar3 != (StuntDouble *)0x0) {
      do {
        local_4c = local_54;
        while( true ) {
          pSVar5 = SelectionManager::nextSelected(sman,&local_4c);
          if (pSVar5 == (StuntDouble *)0x0) break;
          (*(this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser[0xe])
                    (this,pSVar3,pSVar5,pSVar4);
        }
        pSVar3 = SelectionManager::nextSelected(sman,&local_54);
        pSVar4 = SelectionManager::nextSelected(&this->seleMan3_,&local_50);
      } while ((pSVar4 != (StuntDouble *)0x0) && (pSVar3 != (StuntDouble *)0x0));
    }
    return;
  }
  RadialDistrFunc::processOverlapping(&this->super_RadialDistrFunc,sman);
  return;
}

Assistant:

void GofRAngle::processOverlapping(SelectionManager& sman) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    StuntDouble* sd3;
    int i;
    int j;
    int k;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    if (doSele3_) {
      if (evaluator3_.isDynamic()) {
        seleMan3_.setSelectionSet(evaluator3_.evaluate());
      }
      if (sman.getSelectionCount() != seleMan3_.getSelectionCount()) {
        RadialDistrFunc::processOverlapping(sman);
      }
      for (sd1 = sman.beginSelected(i), sd3 = seleMan3_.beginSelected(k);
           sd1 != NULL && sd3 != NULL;
           sd1 = sman.nextSelected(i), sd3 = seleMan3_.nextSelected(k)) {
        for (j = i, sd2 = sman.nextSelected(j); sd2 != NULL;
             sd2 = sman.nextSelected(j)) {
          collectHistogram(sd1, sd2, sd3);
        }
      }
    } else {
      RadialDistrFunc::processOverlapping(sman);
    }
  }